

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  uchar *puVar1;
  uchar *puVar2;
  secp256k1_fe *r;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uchar *seckey;
  uchar *p1;
  ulong uVar15;
  ulong uVar16;
  secp256k1_keypair *keypair;
  secp256k1_fe *a;
  uint64_t uVar17;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uchar *p2;
  uint uVar18;
  undefined1 auVar19 [16];
  uchar pk_expected32 [32];
  secp256k1_ge pk;
  secp256k1_scalar asStack_1a4 [15];
  secp256k1_ge sStack_168;
  secp256k1_fe *psStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  code *pcStack_e8;
  ulong uStack_d8;
  secp256k1_ge *psStack_d0;
  uchar *puStack_c8;
  secp256k1_fe *psStack_c0;
  byte local_b8 [40];
  secp256k1_ge local_90;
  
  if (ctx == (secp256k1_context *)0x0) {
    psStack_c0 = (secp256k1_fe *)0x10e442;
    secp256k1_xonly_pubkey_tweak_add_check_cold_5();
  }
  else if (internal_pubkey != (secp256k1_xonly_pubkey *)0x0) {
    if (tweaked_pubkey32 == (uchar *)0x0) {
      psStack_c0 = (secp256k1_fe *)0x10e44e;
      secp256k1_xonly_pubkey_tweak_add_check_cold_3();
      return 0;
    }
    if (tweak32 == (uchar *)0x0) {
      psStack_c0 = (secp256k1_fe *)0x10e455;
      secp256k1_xonly_pubkey_tweak_add_check_cold_2();
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x10e3a0;
    iVar9 = secp256k1_pubkey_load(ctx,&local_90,(secp256k1_pubkey *)internal_pubkey);
    if (iVar9 == 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x10e3b7;
    iVar9 = secp256k1_ec_pubkey_tweak_add_helper(&local_90,tweak32);
    if (iVar9 == 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x10e3c8;
    secp256k1_fe_normalize_var(&local_90.x);
    r = &local_90.y;
    psStack_c0 = (secp256k1_fe *)0x10e3d5;
    secp256k1_fe_normalize_var(r);
    psStack_c0 = (secp256k1_fe *)0x10e3e0;
    secp256k1_fe_get_b32(local_b8,&local_90.x);
    lVar11 = 0;
    uVar10 = extraout_RAX;
    do {
      uVar12 = uVar10 & 0xffffffff;
      bVar3 = local_b8[lVar11];
      bVar4 = tweaked_pubkey32[lVar11];
      uVar10 = (ulong)((uint)bVar3 - (uint)bVar4);
      if (bVar3 == bVar4) {
        uVar10 = uVar12;
      }
      iVar9 = (int)uVar10;
      if (bVar3 != bVar4) goto LAB_0010e404;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    iVar9 = 0;
LAB_0010e404:
    if (iVar9 != 0) {
      return 0;
    }
    psStack_c0 = (secp256k1_fe *)0x10e412;
    a = r;
    secp256k1_fe_verify(r);
    if (local_90.y.normalized != 0) {
      return (uint)(((uint)local_90.y.n[0] & 1) == tweaked_pk_parity);
    }
    psStack_c0 = (secp256k1_fe *)secp256k1_fe_normalize_var;
    secp256k1_xonly_pubkey_tweak_add_check_cold_1();
    pcStack_e8 = (code *)0x10e48c;
    uStack_d8 = (ulong)(uint)tweaked_pk_parity;
    psStack_d0 = &local_90;
    puStack_c8 = tweaked_pubkey32;
    psStack_c0 = r;
    secp256k1_fe_verify(a);
    uVar10 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar12 = (uVar10 >> 0x34) + a->n[1];
    uVar10 = uVar10 & 0xfffffffffffff;
    uVar14 = (uVar12 >> 0x34) + a->n[2];
    uVar15 = (uVar14 >> 0x34) + a->n[3];
    uVar14 = uVar14 & 0xfffffffffffff;
    uVar17 = (uVar15 >> 0x34) + (a->n[4] & 0xffffffffffff);
    uVar13 = uVar12 & 0xfffffffffffff;
    uVar16 = uVar15 & 0xfffffffffffff;
    if (0xffffefffffc2e < uVar10 &&
        ((uVar14 & uVar12 & uVar15) == 0xfffffffffffff && uVar17 == 0xffffffffffff) ||
        uVar17 >> 0x30 != 0) {
      uVar13 = uVar13 + (uVar10 + 0x1000003d1 >> 0x34);
      uVar14 = uVar14 + (uVar13 >> 0x34);
      keypair = (secp256k1_keypair *)(uVar16 + (uVar14 >> 0x34));
      uVar12 = ((ulong)keypair >> 0x34) + uVar17;
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar12 & 0x3000000000000);
      if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
        pcStack_e8 = secp256k1_keypair_create;
        secp256k1_fe_normalize_var_cold_1();
        pcStack_e8 = (code *)0x0;
        uStack_f0 = 0xfffffffffffff;
        uStack_f8 = 0xffffffffffff;
        psStack_100 = a;
        if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
          secp256k1_keypair_create_cold_4();
        }
        else if (keypair != (secp256k1_keypair *)0x0) {
          keypair->data[0x50] = '\0';
          keypair->data[0x51] = '\0';
          keypair->data[0x52] = '\0';
          keypair->data[0x53] = '\0';
          keypair->data[0x54] = '\0';
          keypair->data[0x55] = '\0';
          keypair->data[0x56] = '\0';
          keypair->data[0x57] = '\0';
          keypair->data[0x58] = '\0';
          keypair->data[0x59] = '\0';
          keypair->data[0x5a] = '\0';
          keypair->data[0x5b] = '\0';
          keypair->data[0x5c] = '\0';
          keypair->data[0x5d] = '\0';
          keypair->data[0x5e] = '\0';
          keypair->data[0x5f] = '\0';
          keypair->data[0x40] = '\0';
          keypair->data[0x41] = '\0';
          keypair->data[0x42] = '\0';
          keypair->data[0x43] = '\0';
          keypair->data[0x44] = '\0';
          keypair->data[0x45] = '\0';
          keypair->data[0x46] = '\0';
          keypair->data[0x47] = '\0';
          keypair->data[0x48] = '\0';
          keypair->data[0x49] = '\0';
          keypair->data[0x4a] = '\0';
          keypair->data[0x4b] = '\0';
          keypair->data[0x4c] = '\0';
          keypair->data[0x4d] = '\0';
          keypair->data[0x4e] = '\0';
          keypair->data[0x4f] = '\0';
          keypair->data[0x30] = '\0';
          keypair->data[0x31] = '\0';
          keypair->data[0x32] = '\0';
          keypair->data[0x33] = '\0';
          keypair->data[0x34] = '\0';
          keypair->data[0x35] = '\0';
          keypair->data[0x36] = '\0';
          keypair->data[0x37] = '\0';
          keypair->data[0x38] = '\0';
          keypair->data[0x39] = '\0';
          keypair->data[0x3a] = '\0';
          keypair->data[0x3b] = '\0';
          keypair->data[0x3c] = '\0';
          keypair->data[0x3d] = '\0';
          keypair->data[0x3e] = '\0';
          keypair->data[0x3f] = '\0';
          keypair->data[0x20] = '\0';
          keypair->data[0x21] = '\0';
          keypair->data[0x22] = '\0';
          keypair->data[0x23] = '\0';
          keypair->data[0x24] = '\0';
          keypair->data[0x25] = '\0';
          keypair->data[0x26] = '\0';
          keypair->data[0x27] = '\0';
          keypair->data[0x28] = '\0';
          keypair->data[0x29] = '\0';
          keypair->data[0x2a] = '\0';
          keypair->data[0x2b] = '\0';
          keypair->data[0x2c] = '\0';
          keypair->data[0x2d] = '\0';
          keypair->data[0x2e] = '\0';
          keypair->data[0x2f] = '\0';
          keypair->data[0x10] = '\0';
          keypair->data[0x11] = '\0';
          keypair->data[0x12] = '\0';
          keypair->data[0x13] = '\0';
          keypair->data[0x14] = '\0';
          keypair->data[0x15] = '\0';
          keypair->data[0x16] = '\0';
          keypair->data[0x17] = '\0';
          keypair->data[0x18] = '\0';
          keypair->data[0x19] = '\0';
          keypair->data[0x1a] = '\0';
          keypair->data[0x1b] = '\0';
          keypair->data[0x1c] = '\0';
          keypair->data[0x1d] = '\0';
          keypair->data[0x1e] = '\0';
          keypair->data[0x1f] = '\0';
          keypair->data[0] = '\0';
          keypair->data[1] = '\0';
          keypair->data[2] = '\0';
          keypair->data[3] = '\0';
          keypair->data[4] = '\0';
          keypair->data[5] = '\0';
          keypair->data[6] = '\0';
          keypair->data[7] = '\0';
          keypair->data[8] = '\0';
          keypair->data[9] = '\0';
          keypair->data[10] = '\0';
          keypair->data[0xb] = '\0';
          keypair->data[0xc] = '\0';
          keypair->data[0xd] = '\0';
          keypair->data[0xe] = '\0';
          keypair->data[0xf] = '\0';
          if (ecmult_gen_ctx->built == 0) {
            secp256k1_keypair_create_cold_2();
            return 0;
          }
          if (seckey == (uchar *)0x0) {
            secp256k1_keypair_create_cold_1();
            return 0;
          }
          iVar9 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_1a4,&sStack_168,seckey);
          secp256k1_keypair_save(keypair,asStack_1a4,&sStack_168);
          cVar8 = ((byte)iVar9 ^ 1) - 1;
          auVar19 = ZEXT216(CONCAT11(cVar8,cVar8));
          auVar19 = pshuflw(auVar19,auVar19,0);
          uVar18 = auVar19._0_4_;
          lVar11 = 0;
          do {
            puVar1 = keypair->data + lVar11;
            uVar5 = *(uint *)(puVar1 + 4);
            uVar6 = *(uint *)(puVar1 + 8);
            uVar7 = *(uint *)(puVar1 + 0xc);
            puVar2 = keypair->data + lVar11;
            *(uint *)puVar2 = *(uint *)puVar1 & uVar18;
            *(uint *)(puVar2 + 4) = uVar5 & uVar18;
            *(uint *)(puVar2 + 8) = uVar6 & uVar18;
            *(uint *)(puVar2 + 0xc) = uVar7 & uVar18;
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x60);
          return iVar9;
        }
        secp256k1_keypair_create_cold_3();
        return 0;
      }
      uVar16 = (ulong)keypair & 0xfffffffffffff;
      uVar14 = uVar14 & 0xfffffffffffff;
      uVar13 = uVar13 & 0xfffffffffffff;
      uVar10 = uVar10 + 0x1000003d1 & 0xfffffffffffff;
      uVar17 = uVar12 & 0xffffffffffff;
    }
    a->n[0] = uVar10;
    a->n[1] = uVar13;
    a->n[2] = uVar14;
    a->n[3] = uVar16;
    a->n[4] = uVar17;
    a->magnitude = 1;
    a->normalized = 1;
    secp256k1_fe_verify(a);
    return extraout_EAX;
  }
  psStack_c0 = (secp256k1_fe *)0x10e447;
  secp256k1_xonly_pubkey_tweak_add_check_cold_4();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}